

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.c
# Opt level: O0

char * strnstr(char *s,char *find,size_t slen)

{
  char cVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  char *__s1;
  size_t len;
  char sc;
  ulong uStack_28;
  char c;
  size_t slen_local;
  char *find_local;
  char *s_local;
  
  cVar1 = *find;
  find_local = s;
  if (cVar1 != '\0') {
    __n = strlen(find + 1);
    uStack_28 = slen;
    __s1 = s;
    do {
      do {
        find_local = __s1;
        uVar3 = uStack_28 - 1;
        if (uStack_28 == 0) {
          return (char *)0x0;
        }
        __s1 = find_local + 1;
        if (*find_local == '\0') {
          return (char *)0x0;
        }
        uStack_28 = uVar3;
      } while (*find_local != cVar1);
      if (uVar3 < __n) {
        return (char *)0x0;
      }
      iVar2 = strncmp(__s1,find + 1,__n);
    } while (iVar2 != 0);
  }
  return find_local;
}

Assistant:

char *
strnstr(const char *s, const char *find, size_t slen)
{
    char c, sc;
    size_t len;

    if ((c = *find++) != '\0') {
        len = strlen(find);
        do {
            do {
                if ((slen-- < 1) || ((sc = *s++) == '\0')) {
                    return NULL;
                }
            } while (sc != c);
            if (len > slen) {
                return NULL;
            }
        } while (strncmp(s, find, len));
        s--;
    }
    return (char *)s;
}